

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O0

type __thiscall
dg::pta::PointerGraph::
nodeFactory<(dg::pta::PSNodeType)4,dg::pta::PSNode*&,unsigned_long_const&,dg::pta::PSNodeGep>
          (PointerGraph *this,PSNode **args,unsigned_long *args_1)

{
  uint uVar1;
  type pPVar2;
  type *in_RDX;
  type *in_RSI;
  PointerGraph *in_RDI;
  PSNode *in_stack_ffffffffffffffb8;
  IDType id;
  undefined4 in_stack_ffffffffffffffc8;
  Offset o;
  Offset local_20;
  type *local_18;
  type *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  pPVar2 = (type)operator_new(0xf0);
  uVar1 = getNewNodeId(in_RDI);
  id = (IDType)((ulong)in_RDI >> 0x20);
  o.offset = *local_10;
  Offset::Offset(&local_20,*local_18);
  PSNodeGep::PSNodeGep
            ((PSNodeGep *)CONCAT44(uVar1,in_stack_ffffffffffffffc8),id,in_stack_ffffffffffffffb8,o);
  return pPVar2;
}

Assistant:

typename std::enable_if<!std::is_same<Node, PSNode>::value, Node *>::type
    nodeFactory(Args &&...args) {
        return new Node(getNewNodeId(), std::forward<Args>(args)...);
    }